

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O1

bool __thiscall cmSourceFileLocation::Matches(cmSourceFileLocation *this,cmSourceFileLocation *loc)

{
  cmMakefile *this_00;
  size_t sVar1;
  cmSourceFileLocation *loc_00;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  pointer __s2;
  cmSourceFileLocation *this_01;
  string local_60;
  string local_40;
  
  if (this->Makefile == (cmMakefile *)0x0) {
    __assert_fail("this->Makefile",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmSourceFileLocation.cxx"
                  ,0xd8,"bool cmSourceFileLocation::Matches(const cmSourceFileLocation &)");
  }
  if (this->AmbiguousExtension == loc->AmbiguousExtension) {
    if ((this->Name)._M_string_length != (loc->Name)._M_string_length) {
      return false;
    }
    bVar2 = cmsys::SystemTools::ComparePath(&this->Name,&loc->Name);
  }
  else {
    this_01 = this;
    loc_00 = loc;
    if (this->AmbiguousExtension != false) {
      this_01 = loc;
      loc_00 = this;
    }
    bVar2 = MatchesAmbiguousExtension(this_01,loc_00);
  }
  if (bVar2 == false) {
    return false;
  }
  if (this->AmbiguousDirectory == false) {
    if (loc->AmbiguousDirectory != false) {
LAB_00272eef:
      if (loc->AmbiguousDirectory != true) goto LAB_00272fb5;
      pcVar4 = cmMakefile::GetCurrentSourceDirectory(loc->Makefile);
      cmsys::SystemTools::CollapseFullPath(&local_60,&loc->Directory,pcVar4);
      pcVar4 = cmMakefile::GetCurrentBinaryDirectory(loc->Makefile);
      cmsys::SystemTools::CollapseFullPath(&local_40,&loc->Directory,pcVar4);
      sVar1 = (this->Directory)._M_string_length;
      if ((local_60._M_string_length != sVar1) ||
         ((local_60._M_string_length != 0 &&
          (iVar3 = bcmp(local_60._M_dataplus._M_p,(this->Directory)._M_dataplus._M_p,
                        local_60._M_string_length), iVar3 != 0)))) {
        if (local_40._M_string_length != sVar1) goto LAB_00272f73;
        if (local_40._M_string_length != 0) {
          __s2 = (this->Directory)._M_dataplus._M_p;
          goto LAB_00272f65;
        }
      }
      goto LAB_00272f77;
    }
  }
  else {
    if (loc->AmbiguousDirectory != true) {
      if (this->AmbiguousDirectory == false) goto LAB_00272eef;
      pcVar4 = cmMakefile::GetCurrentSourceDirectory(this->Makefile);
      cmsys::SystemTools::CollapseFullPath(&local_60,&this->Directory,pcVar4);
      pcVar4 = cmMakefile::GetCurrentBinaryDirectory(this->Makefile);
      cmsys::SystemTools::CollapseFullPath(&local_40,&this->Directory,pcVar4);
      sVar1 = (loc->Directory)._M_string_length;
      if ((local_60._M_string_length == sVar1) &&
         ((local_60._M_string_length == 0 ||
          (iVar3 = bcmp(local_60._M_dataplus._M_p,(loc->Directory)._M_dataplus._M_p,
                        local_60._M_string_length), iVar3 == 0)))) {
LAB_00272f77:
        bVar2 = true;
      }
      else {
        if (local_40._M_string_length == sVar1) {
          if (local_40._M_string_length != 0) {
            __s2 = (loc->Directory)._M_dataplus._M_p;
LAB_00272f65:
            iVar3 = bcmp(local_40._M_dataplus._M_p,__s2,local_40._M_string_length);
            if (iVar3 != 0) goto LAB_00272f73;
          }
          goto LAB_00272f77;
        }
LAB_00272f73:
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (!bVar2) {
        return false;
      }
      goto LAB_00272fb5;
    }
    this_00 = this->Makefile;
    if (this_00 != loc->Makefile) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,
                 "Matches error: Each side has a directory relative to a different location. This can occur when referencing a source file from a different directory.  This is not yet allowed."
                 ,"");
      cmMakefile::IssueMessage(this_00,INTERNAL_ERROR,&local_60,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p == &local_60.field_2) {
        return false;
      }
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      return false;
    }
  }
  sVar1 = (this->Directory)._M_string_length;
  if ((sVar1 != (loc->Directory)._M_string_length) ||
     ((sVar1 != 0 &&
      (iVar3 = bcmp((this->Directory)._M_dataplus._M_p,(loc->Directory)._M_dataplus._M_p,sVar1),
      iVar3 != 0)))) {
    return false;
  }
LAB_00272fb5:
  Update(this,loc);
  return true;
}

Assistant:

bool cmSourceFileLocation::Matches(cmSourceFileLocation const& loc)
{
  assert(this->Makefile);
  if(this->AmbiguousExtension == loc.AmbiguousExtension)
    {
    // Both extensions are similarly ambiguous.  Since only the old fixed set
    // of extensions will be tried, the names must match at this point to be
    // the same file.
    if(this->Name.size() != loc.Name.size() ||
      !cmSystemTools::ComparePath(this->Name, loc.Name))
      {
      return false;
      }
    }
  else
    {
    const cmSourceFileLocation* loc1;
    const cmSourceFileLocation* loc2;
    if(this->AmbiguousExtension)
      {
      // Only "this" extension is ambiguous.
      loc1 = &loc;
      loc2 = this;
      }
    else
      {
      // Only "loc" extension is ambiguous.
      loc1 = this;
      loc2 = &loc;
      }
    if(!loc1->MatchesAmbiguousExtension(*loc2))
      {
      return false;
      }
    }

  if(!this->AmbiguousDirectory && !loc.AmbiguousDirectory)
    {
    // Both sides have absolute directories.
    if(this->Directory != loc.Directory)
      {
      return false;
      }
    }
  else if(this->AmbiguousDirectory && loc.AmbiguousDirectory)
    {
    if (this->Makefile == loc.Makefile)
      {
      // Both sides have directories relative to the same location.
      if(this->Directory != loc.Directory)
        {
        return false;
        }
      }
    else
      {
      // Each side has a directory relative to a different location.
      // This can occur when referencing a source file from a different
      // directory.  This is not yet allowed.
      this->Makefile->IssueMessage(
        cmake::INTERNAL_ERROR,
        "Matches error: Each side has a directory relative to a different "
        "location. This can occur when referencing a source file from a "
        "different directory.  This is not yet allowed."
        );
      return false;
      }
    }
  else if(this->AmbiguousDirectory)
    {
    // Compare possible directory combinations.
    std::string const& srcDir =
      cmSystemTools::CollapseFullPath(
        this->Directory, this->Makefile->GetCurrentSourceDirectory());
    std::string const& binDir =
      cmSystemTools::CollapseFullPath(
        this->Directory, this->Makefile->GetCurrentBinaryDirectory());
    if(srcDir != loc.Directory &&
       binDir != loc.Directory)
      {
      return false;
      }
    }
  else if(loc.AmbiguousDirectory)
    {
    // Compare possible directory combinations.
    std::string const& srcDir =
      cmSystemTools::CollapseFullPath(
        loc.Directory, loc.Makefile->GetCurrentSourceDirectory());
    std::string const& binDir =
      cmSystemTools::CollapseFullPath(
        loc.Directory, loc.Makefile->GetCurrentBinaryDirectory());
    if(srcDir != this->Directory &&
       binDir != this->Directory)
      {
      return false;
      }
    }

  // File locations match.
  this->Update(loc);
  return true;
}